

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O1

bool __thiscall
NNTreeIterator::deepen(NNTreeIterator *this,QPDFObjectHandle *node,bool first,bool allow_empty)

{
  list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_> *this_00;
  size_t *psVar1;
  QPDF *pQVar2;
  QPDFObjectHandle *oh;
  uint n;
  char cVar3;
  uint __val;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  uint uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  QPDFObjGen QVar9;
  _Node *p_Var10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 uVar11;
  long *plVar12;
  undefined7 in_register_00000009;
  size_type *psVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  element_type *peVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  undefined7 in_register_00000011;
  iterator __end1;
  NNTreeIterator *this_02;
  _List_node_base *p_Var17;
  ulong uVar18;
  byte bVar19;
  uint uVar20;
  QPDFObjectHandle next;
  QPDFObjectHandle kids;
  QPDFObjectHandle items;
  list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_> opath;
  set seen;
  string local_158;
  NNTreeIterator *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined4 local_104;
  __uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_> *local_100 [2];
  __uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_> local_f0 [2];
  QPDFObjectHandle local_e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_d0;
  ulong local_c8;
  undefined4 local_bc;
  QPDFObjectHandle local_b8;
  QPDF *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_a0;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  QPDFObjectHandle local_88;
  _List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_> local_78;
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  local_60;
  
  local_bc = (undefined4)CONCAT71(in_register_00000009,allow_empty);
  local_104 = (undefined4)CONCAT71(in_register_00000011,first);
  this_00 = &this->path;
  local_130 = this;
  std::__cxx11::list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::
  list((list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_> *)&local_78,
       this_00);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var17 = (_List_node_base *)this_00;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  while (p_Var17 = (((_List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
                      *)&p_Var17->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var17 != (_List_node_base *)this_00) {
    QVar9 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)(p_Var17 + 1));
    QPDFObjGen::set::add((set *)&local_60,QVar9);
  }
  local_a0 = &(local_130->node).super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  local_d0 = &(node->super_BaseHandle).obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  local_c8 = 0;
  do {
    paVar16 = &local_158.field_2;
    paVar14 = &local_128.field_2;
    if ((local_c8 & 1) != 0) break;
    QVar9 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen(&node->super_BaseHandle);
    bVar5 = QPDFObjGen::set::add((set *)&local_60,QVar9);
    if (!bVar5) {
      pQVar2 = local_130->impl->qpdf;
      local_158._M_dataplus._M_p = (pointer)paVar16;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,"loop detected while traversing name/number tree","");
      warn(pQVar2,node,&local_158);
LAB_00180ef3:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar16) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      bVar19 = 1;
      goto LAB_00180f0c;
    }
    bVar5 = QPDFObjectHandle::isDictionary(node);
    if (!bVar5) {
      pQVar2 = local_130->impl->qpdf;
      local_158._M_dataplus._M_p = (pointer)paVar16;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,"non-dictionary node while traversing name/number tree","");
      warn(pQVar2,node,&local_158);
      goto LAB_00180ef3;
    }
    local_158._M_dataplus._M_p = (pointer)paVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"/Kids","");
    QPDFObjectHandle::getKey(&local_b8,(string *)node);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar16) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    bVar5 = QPDFObjectHandle::isArray(&local_b8);
    iVar6 = 0;
    if (bVar5) {
      iVar6 = QPDFObjectHandle::getArrayNItems(&local_b8);
    }
    (*(code *)**(undefined8 **)local_130->impl->details)();
    QPDFObjectHandle::getKey(&local_88,(string *)node);
    bVar5 = QPDFObjectHandle::isArray(&local_88);
    iVar7 = 0;
    if (bVar5) {
      iVar7 = QPDFObjectHandle::getArrayNItems(&local_88);
    }
    this_02 = local_130;
    if (iVar7 < 1) {
      if (iVar6 < 1) {
        if ((char)local_bc != '\0') {
          bVar5 = QPDFObjectHandle::isArray(&local_88);
          this_02 = local_130;
          if (bVar5) {
            (local_130->node).super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (node->super_BaseHandle).obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(local_a0,local_d0);
            this_02->item_number = -1;
            goto LAB_00180851;
          }
        }
        pQVar2 = local_130->impl->qpdf;
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (*(code *)**(undefined8 **)local_130->impl->details)();
        std::operator+(&local_128,"name/number tree node has neither non-empty ",__rhs);
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_128);
        psVar13 = (size_type *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_158.field_2._M_allocated_capacity = *psVar13;
          local_158.field_2._8_8_ = plVar12[3];
          local_158._M_dataplus._M_p = (pointer)paVar16;
        }
        else {
          local_158.field_2._M_allocated_capacity = *psVar13;
          local_158._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_158._M_string_length = plVar12[1];
        *plVar12 = (long)psVar13;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        warn(pQVar2,node,&local_158);
        uVar11 = extraout_RAX;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != paVar16) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          uVar11 = extraout_RAX_00;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != paVar14) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          uVar11 = extraout_RAX_01;
        }
        local_c8 = CONCAT71((int7)((ulong)uVar11 >> 8),1);
        goto LAB_0018085e;
      }
      n = iVar6 - 1;
      if ((char)local_104 != '\0') {
        n = 0;
      }
      local_158._M_dataplus._M_p._0_4_ = n;
      p_Var10 = std::__cxx11::
                list<NNTreeIterator::PathElement,std::allocator<NNTreeIterator::PathElement>>::
                _M_create_node<QPDFObjectHandle_const&,int&>
                          ((list<NNTreeIterator::PathElement,std::allocator<NNTreeIterator::PathElement>>
                            *)this_00,node,(int *)&local_158);
      std::__detail::_List_node_base::_M_hook(&p_Var10->super__List_node_base);
      psVar1 = &(local_130->path).
                super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      QPDFObjectHandle::getArrayItem(&local_e0,(int)&local_b8);
      bVar5 = QPDFObjectHandle::isIndirect(&local_e0);
      if (!bVar5) {
        local_a8 = local_130->impl->qpdf;
        __val = -n;
        if (0 < (int)n) {
          __val = n;
        }
        uVar18 = (ulong)__val;
        cVar3 = (char)((int)n >> 0x1f);
        if (local_130->impl->auto_repair == true) {
          uVar20 = 1;
          if (9 < __val) {
            uVar4 = 4;
            do {
              uVar20 = uVar4;
              uVar8 = (uint)uVar18;
              if (uVar8 < 100) {
                uVar20 = uVar20 - 2;
                goto LAB_00180ad3;
              }
              if (uVar8 < 1000) {
                uVar20 = uVar20 - 1;
                goto LAB_00180ad3;
              }
              if (uVar8 < 10000) goto LAB_00180ad3;
              uVar18 = uVar18 / 10000;
              uVar4 = uVar20 + 4;
            } while (99999 < uVar8);
            uVar20 = uVar20 + 1;
          }
LAB_00180ad3:
          local_100[0] = local_f0;
          std::__cxx11::string::_M_construct((ulong)local_100,(char)uVar20 - cVar3);
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((long)&(local_100[0]->_M_t).
                                     super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                     .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl +
                             (ulong)(n >> 0x1f)),uVar20,__val);
          plVar12 = (long *)std::__cxx11::string::replace((ulong)local_100,0,(char *)0x0,0x2b6359);
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 == paVar14) {
            local_128.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_128.field_2._8_8_ = plVar12[3];
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          }
          else {
            local_128.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_128._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_128._M_string_length = plVar12[1];
          *plVar12 = (long)paVar14;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_128);
          peVar15 = (element_type *)(plVar12 + 2);
          if ((element_type *)*plVar12 == peVar15) {
            local_158.field_2._M_allocated_capacity =
                 *(undefined8 *)
                  &(peVar15->value).
                   super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   .
                   super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            ;
            local_158.field_2._8_8_ = plVar12[3];
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          }
          else {
            local_158.field_2._M_allocated_capacity =
                 *(undefined8 *)
                  &(peVar15->value).
                   super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   .
                   super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            ;
            local_158._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_158._M_string_length = plVar12[1];
          *plVar12 = (long)peVar15;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          warn(local_a8,node,&local_158);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          if (local_100[0] != local_f0) {
            operator_delete(local_100[0],
                            (ulong)((long)local_f0[0]._M_t.
                                          super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                          .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                          _M_head_impl + 1));
          }
          oh = (QPDFObjectHandle *)local_130->impl->qpdf;
          local_98 = local_e0.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_90 = local_e0.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if (local_e0.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_e0.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_e0.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_e0.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_e0.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          QPDF::makeIndirectObject((QPDF *)&local_158,oh);
          this_01._M_pi =
               local_e0.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          local_e0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length;
          local_e0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)local_158._M_dataplus._M_p;
          local_158._M_dataplus._M_p = (pointer)0x0;
          local_158._M_string_length = 0;
          if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length);
          }
          if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
          }
          QPDFObjectHandle::setArrayItem(&local_b8,n,&local_e0);
        }
        else {
          uVar20 = 1;
          if (9 < __val) {
            uVar4 = 4;
            do {
              uVar20 = uVar4;
              uVar8 = (uint)uVar18;
              if (uVar8 < 100) {
                uVar20 = uVar20 - 2;
                goto LAB_00180cd4;
              }
              if (uVar8 < 1000) {
                uVar20 = uVar20 - 1;
                goto LAB_00180cd4;
              }
              if (uVar8 < 10000) goto LAB_00180cd4;
              uVar18 = uVar18 / 10000;
              uVar4 = uVar20 + 4;
            } while (99999 < uVar8);
            uVar20 = uVar20 + 1;
          }
LAB_00180cd4:
          local_100[0] = local_f0;
          std::__cxx11::string::_M_construct((ulong)local_100,(char)uVar20 - cVar3);
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((long)&(local_100[0]->_M_t).
                                     super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                     .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl +
                             (ulong)(n >> 0x1f)),uVar20,__val);
          plVar12 = (long *)std::__cxx11::string::replace((ulong)local_100,0,(char *)0x0,0x2b6364);
          paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 == paVar16) {
            local_128.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
            local_128.field_2._8_8_ = plVar12[3];
            local_128._M_dataplus._M_p = (pointer)paVar14;
          }
          else {
            local_128.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
            local_128._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_128._M_string_length = plVar12[1];
          *plVar12 = (long)paVar16;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_128);
          psVar13 = (size_type *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_158.field_2._M_allocated_capacity = *psVar13;
            local_158.field_2._8_8_ = plVar12[3];
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          }
          else {
            local_158.field_2._M_allocated_capacity = *psVar13;
            local_158._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_158._M_string_length = plVar12[1];
          *plVar12 = (long)psVar13;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          warn(local_a8,node,&local_158);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != paVar14) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          if (local_100[0] != local_f0) {
            operator_delete(local_100[0],
                            (ulong)((long)local_f0[0]._M_t.
                                          super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                          .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                          _M_head_impl + 1));
          }
        }
      }
      (node->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = local_e0.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (local_d0,&local_e0.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      if (local_e0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_e0.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      bVar5 = true;
    }
    else {
      iVar6 = iVar7 + -2;
      if ((char)local_104 != '\0') {
        iVar6 = 0;
      }
      (local_130->node).super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (node->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(local_a0,local_d0);
      this_02->item_number = iVar6;
LAB_00180851:
      updateIValue(this_02,true);
LAB_0018085e:
      bVar5 = false;
    }
    if (local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
  } while (bVar5);
  bVar19 = (byte)local_c8;
LAB_00180f0c:
  if (&this_00->
       super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
      != &local_78 && (~bVar19 & 1) == 0) {
    std::__cxx11::list<NNTreeIterator::PathElement,std::allocator<NNTreeIterator::PathElement>>::
    _M_assign_dispatch<std::_List_const_iterator<NNTreeIterator::PathElement>>
              ((list<NNTreeIterator::PathElement,std::allocator<NNTreeIterator::PathElement>> *)
               this_00,local_78._M_impl._M_node.super__List_node_base._M_next);
  }
  std::
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  ::~_Rb_tree(&local_60);
  std::__cxx11::
  _List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::_M_clear
            (&local_78);
  return (bool)(~bVar19 & 1);
}

Assistant:

bool
NNTreeIterator::deepen(QPDFObjectHandle node, bool first, bool allow_empty)
{
    // Starting at this node, descend through the first or last kid until we reach a node with
    // items. If we succeed, return true; otherwise return false and leave path alone.

    auto opath = this->path;
    bool failed = false;

    QPDFObjGen::set seen;
    for (auto const& i: this->path) {
        seen.add(i.node);
    }
    while (!failed) {
        if (!seen.add(node)) {
            QTC::TC("qpdf", "NNTree deepen: loop");
            warn(impl.qpdf, node, "loop detected while traversing name/number tree");
            failed = true;
            break;
        }

        if (!node.isDictionary()) {
            QTC::TC("qpdf", "NNTree node is not a dictionary");
            warn(impl.qpdf, node, "non-dictionary node while traversing name/number tree");
            failed = true;
            break;
        }

        auto kids = node.getKey("/Kids");
        int nkids = kids.isArray() ? kids.getArrayNItems() : 0;
        auto items = node.getKey(impl.details.itemsKey());
        int nitems = items.isArray() ? items.getArrayNItems() : 0;
        if (nitems > 0) {
            setItemNumber(node, first ? 0 : nitems - 2);
            break;
        } else if (nkids > 0) {
            int kid_number = first ? 0 : nkids - 1;
            addPathElement(node, kid_number);
            auto next = kids.getArrayItem(kid_number);
            if (!next.isIndirect()) {
                if (impl.auto_repair) {
                    QTC::TC("qpdf", "NNTree fix indirect kid");
                    warn(
                        impl.qpdf,
                        node,
                        ("converting kid number " + std::to_string(kid_number) +
                         " to an indirect object"));
                    next = impl.qpdf.makeIndirectObject(next);
                    kids.setArrayItem(kid_number, next);
                } else {
                    QTC::TC("qpdf", "NNTree warn indirect kid");
                    warn(
                        impl.qpdf,
                        node,
                        ("kid number " + std::to_string(kid_number) +
                         " is not an indirect object"));
                }
            }
            node = next;
        } else if (allow_empty && items.isArray()) {
            QTC::TC("qpdf", "NNTree deepen found empty");
            setItemNumber(node, -1);
            break;
        } else {
            QTC::TC("qpdf", "NNTree deepen: invalid node");
            warn(
                impl.qpdf,
                node,
                ("name/number tree node has neither non-empty " + impl.details.itemsKey() +
                 " nor /Kids"));
            failed = true;
            break;
        }
    }
    if (failed) {
        this->path = opath;
        return false;
    }
    return true;
}